

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int flatbuffers::ToUTF8(uint32_t ucc,string *out)

{
  char cVar1;
  byte bVar2;
  uint32_t local_28;
  int j;
  uint32_t remain_bits;
  uint32_t max_bits;
  int i;
  string *out_local;
  uint32_t ucc_local;
  
  if ((ucc & 0x80000000) != 0) {
    __assert_fail("!(ucc & 0x80000000)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,500,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
  }
  remain_bits = 0;
  while( true ) {
    if (5 < (int)remain_bits) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x206,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
    }
    cVar1 = (char)remain_bits;
    bVar2 = cVar1 * '\x05' + '\x06' + ((remain_bits != 0 ^ 0xffU) & 1);
    if (ucc < (uint)(1 << (bVar2 & 0x1f))) break;
    remain_bits = remain_bits + 1;
  }
  std::__cxx11::string::operator+=
            ((string *)out,
             (byte)(0xfe << (bVar2 + cVar1 * -6 & 0x1f)) | (byte)(ucc >> (cVar1 * '\x06' & 0x1fU)));
  local_28 = remain_bits;
  while (local_28 = local_28 - 1, -1 < (int)local_28) {
    std::__cxx11::string::operator+=
              ((string *)out,(byte)(ucc >> ((char)local_28 * '\x06' & 0x1fU)) & 0x3f | 0x80);
  }
  return remain_bits + 1;
}

Assistant:

inline int ToUTF8(uint32_t ucc, std::string *out) {
  FLATBUFFERS_ASSERT(!(ucc & 0x80000000));  // Top bit can't be set.
  // 6 possible encodings: http://en.wikipedia.org/wiki/UTF-8
  for (int i = 0; i < 6; i++) {
    // Max bits this encoding can represent.
    uint32_t max_bits = 6 + i * 5 + static_cast<int>(!i);
    if (ucc < (1u << max_bits)) {  // does it fit?
      // Remaining bits not encoded in the first byte, store 6 bits each
      uint32_t remain_bits = i * 6;
      // Store first byte:
      (*out) += static_cast<char>((0xFE << (max_bits - remain_bits)) |
                                  (ucc >> remain_bits));
      // Store remaining bytes:
      for (int j = i - 1; j >= 0; j--) {
        (*out) += static_cast<char>(((ucc >> (j * 6)) & 0x3F) | 0x80);
      }
      return i + 1;  // Return the number of bytes added.
    }
  }
  FLATBUFFERS_ASSERT(0);  // Impossible to arrive here.
  return -1;
}